

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::PortSymbol::fromSyntax
          (PortSymbol *this,PortListSyntax *syntax,Scope *scope,
          SmallVectorBase<const_slang::ast::Symbol_*> *results,
          SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>
          *implicitMembers,
          span<const_std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_18446744073709551615UL>
          portDeclarations)

{
  char *pcVar1;
  DotMemberClauseSyntax **this_00;
  SymbolKind SVar2;
  SyntaxKind SVar3;
  DataTypeSyntax *syntax_00;
  Symbol *pSVar4;
  PortConcatenationSyntax *pPVar5;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar6;
  InterfacePortHeaderSyntax *header;
  DeclaratorSyntax *pDVar7;
  int *piVar8;
  uint uVar9;
  span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>
  unpackedDimensions;
  byte bVar10;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attrs;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attrs_00;
  string_view modport;
  undefined1 auVar11 [16];
  Compilation **ppCVar12;
  undefined1 auVar13 [8];
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
  *ppVar14;
  undefined8 uVar15;
  bool bVar16;
  ushort uVar17;
  int iVar18;
  uint uVar19;
  ArgumentDirection AVar20;
  SourceLocation SVar21;
  NetSymbol *pNVar22;
  Symbol *pSVar23;
  char *pcVar24;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar25;
  PortSymbol *pPVar26;
  NetType *pNVar27;
  Symbol *pSVar28;
  Diagnostic *pDVar29;
  StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>
  type;
  SymbolIndex SVar30;
  SyntaxNode *pSVar31;
  char *pcVar32;
  size_t sVar33;
  not_null<const_slang::syntax::DeclaratorSyntax_*> nVar34;
  __extent_storage<18446744073709551615UL> iface;
  Scope *pSVar35;
  Scope *pSVar36;
  bitmask<slang::ast::LookupFlags> bVar37;
  undefined1 *hash;
  Token *args_1;
  ConfigBlockSymbol *pCVar38;
  PortInfo *in_R9;
  byte *pbVar39;
  ulong uVar40;
  NetPortHeaderSyntax *netHeader;
  pointer ppVar41;
  long lVar42;
  size_type __rlen;
  string_view *psVar43;
  char *pcVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  char cVar50;
  char cVar53;
  char cVar54;
  byte bVar55;
  char cVar56;
  char cVar57;
  char cVar58;
  byte bVar59;
  char cVar60;
  char cVar61;
  char cVar62;
  byte bVar63;
  char cVar64;
  char cVar65;
  char cVar66;
  byte bVar67;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  string_view name_00;
  string_view name_01;
  Token name_02;
  string_view sVar68;
  SourceRange SVar69;
  SourceLocation declLoc;
  locator res;
  Token name;
  size_t pos;
  string_view name_3;
  value_type *elements;
  AnsiPortListBuilder builder;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffb38;
  __extent_storage<18446744073709551615UL> _Var70;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffb40;
  undefined1 local_498 [8];
  char *local_490;
  locator local_488;
  pointer local_470;
  Token local_468;
  Scope *local_450;
  uint64_t local_448;
  Scope *local_440;
  Scope *local_438;
  PortInfo local_430;
  Scope *local_3e8;
  SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *local_3e0;
  Scope *local_3d8;
  char *local_3d0;
  ulong local_3c8;
  string_view *local_3c0;
  PortInfo *local_3b8;
  PortSymbol *local_3b0;
  undefined8 local_3a8;
  char cStack_3a0;
  char cStack_39f;
  char cStack_39e;
  byte bStack_39d;
  char cStack_39c;
  char cStack_39b;
  char cStack_39a;
  byte bStack_399;
  Symbol *local_390;
  Scope *local_388;
  DefinitionSymbol *local_380;
  char local_378;
  char cStack_377;
  char cStack_376;
  byte bStack_375;
  char cStack_374;
  char cStack_373;
  char cStack_372;
  byte bStack_371;
  char cStack_370;
  char cStack_36f;
  char cStack_36e;
  byte bStack_36d;
  char cStack_36c;
  char cStack_36b;
  char cStack_36a;
  byte bStack_369;
  char local_368;
  char cStack_367;
  char cStack_366;
  byte bStack_365;
  char cStack_364;
  char cStack_363;
  char cStack_362;
  byte bStack_361;
  char cStack_360;
  char cStack_35f;
  char cStack_35e;
  byte bStack_35d;
  char cStack_35c;
  char cStack_35b;
  char cStack_35a;
  byte bStack_359;
  undefined1 local_358 [32];
  undefined1 local_338 [16];
  DefinitionSymbol *local_328;
  char cStack_320;
  char acStack_31f [7];
  NetType *local_318;
  bool local_310;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
  *local_78;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
  *local_70;
  undefined8 local_68;
  Scope *local_60;
  char *local_58;
  string_view *local_50;
  undefined1 local_48 [16];
  
  local_440 = (Scope *)syntax;
  local_438 = scope;
  local_3e0 = implicitMembers;
  local_3b0 = this;
  local_358._8_8_ = syntax;
  local_358._16_8_ = results;
  if ((this->super_Symbol).kind == AssociativeArrayType) {
    local_358._0_8_ = *(undefined8 *)&syntax->super_SyntaxNode;
    local_358._24_4_ = InOut;
    local_338 = (undefined1  [16])0x0;
    local_328 = (DefinitionSymbol *)0x0;
    cStack_320 = '\0';
    acStack_31f[0] = '\0';
    acStack_31f[1] = '\0';
    acStack_31f[2] = '\0';
    acStack_31f[3] = '\0';
    acStack_31f[4] = '\0';
    acStack_31f[5] = '\0';
    acStack_31f[6] = '\0';
    local_318 = (NetType *)0x0;
    local_310 = false;
    pbVar39 = (byte *)((long)&(this->type->super_Symbol).kind + 1);
    local_3b8 = in_R9;
    if ((byte *)0x1 < pbVar39) {
      uVar40 = (ulong)pbVar39 >> 1;
      lVar42 = 0;
      do {
        ppSVar25 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                             ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                              (*(long *)&local_3b0->direction + lVar42));
        uVar15 = local_358._0_8_;
        bVar37.m_bits = (underlying_type)implicitMembers;
        pSVar6 = *ppSVar25;
        if (pSVar6->kind == ImplicitAnsiPort) {
          header = (InterfacePortHeaderSyntax *)pSVar6[3].parent;
          pDVar7 = (DeclaratorSyntax *)pSVar6[3].previewNode;
          SVar3 = (header->super_PortHeaderSyntax).super_SyntaxNode.kind;
          if (SVar3 == InterfacePortHeader) {
            if ((header->nameOrKeyword).kind == InterfaceKeyword) {
              if (header->modport == (DotMemberClauseSyntax *)0x0) {
                sVar68 = (string_view)ZEXT816(0);
              }
              else {
                sVar68 = parsing::Token::valueText(&header->modport->member);
              }
              pSVar31 = pSVar6[2].previewNode;
              _Var70._M_extent_value = *(size_t *)(pSVar6 + 3);
              iface._M_extent_value = 0;
              bVar16 = true;
            }
            else {
              anon_unknown_0::getInterfacePortInfo
                        ((tuple<const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
                          *)&local_430,(Scope *)local_358._8_8_,header);
              pSVar31 = pSVar6[2].previewNode;
              _Var70._M_extent_value = *(size_t *)(pSVar6 + 3);
              nVar34.ptr = local_430.syntax.ptr;
              iface._M_extent_value = local_430.attrs._M_extent._M_extent_value;
              pCVar38 = (ConfigBlockSymbol *)local_430.attrs._M_ptr;
LAB_002276ee:
              sVar68._M_str = (char *)pCVar38;
              sVar68._M_len = (size_t)nVar34.ptr;
              bVar16 = false;
            }
            attrs._M_extent._M_extent_value = _Var70._M_extent_value;
            attrs._M_ptr = (pointer)pSVar31;
            pSVar28 = anon_unknown_0::AnsiPortListBuilder::add
                                ((AnsiPortListBuilder *)local_358,pDVar7,
                                 (DefinitionSymbol *)iface._M_extent_value,sVar68,bVar16,attrs);
          }
          else {
            AVar20 = local_358._24_4_;
            if (SVar3 == NetPortHeader) {
              if ((header->nameOrKeyword).info != (Info *)0x0) {
                AVar20 = SemanticFacts::getDirection((header->nameOrKeyword).kind);
              }
              type.storage = (Storage *)header[1].super_PortHeaderSyntax.super_SyntaxNode.parent;
              pNVar27 = Compilation::getNetType
                                  ((Compilation *)local_358._0_8_,*(TokenKind *)&header->modport);
              _Var70._M_extent_value = *(size_t *)(pSVar6 + 3);
LAB_002278bd:
              attrs_00._M_extent._M_extent_value = in_stack_fffffffffffffb40._M_extent_value;
              attrs_00._M_ptr = (pointer)_Var70._M_extent_value;
              pSVar28 = anon_unknown_0::AnsiPortListBuilder::add
                                  ((AnsiPortListBuilder *)local_358,pDVar7,AVar20,
                                   (DataTypeSyntax *)type.storage,pNVar27,attrs_00);
              _Var70._M_extent_value = in_stack_fffffffffffffb40._M_extent_value;
            }
            else {
              if ((((*(long *)&header[1].super_PortHeaderSyntax.super_SyntaxNode != 0) ||
                   (header[1].super_PortHeaderSyntax.super_SyntaxNode.previewNode !=
                    (SyntaxNode *)0x0)) ||
                  (piVar8 = *(int **)&header[1].nameOrKeyword, *piVar8 != 0xf7)) ||
                 ((*(long *)(piVar8 + 8) != 0 || (*(long *)(piVar8 + 0x16) != 0)))) {
                this_00 = &header->modport;
                sVar68 = slang::syntax::SyntaxFacts::getSimpleTypeName
                                   (*(DataTypeSyntax **)&header[1].nameOrKeyword);
                name_01._M_len = sVar68._M_str;
                if ((Scope *)sVar68._M_len != (Scope *)0x0) {
                  name_01._M_str = (char *)0x1;
                  pNVar27 = (NetType *)
                            Lookup::unqualified((Lookup *)local_358._8_8_,(Scope *)sVar68._M_len,
                                                name_01,bVar37);
                  if (pNVar27 != (NetType *)0x0) {
                    if ((pNVar27->super_Symbol).kind == NetType) {
                      AVar20 = local_358._24_4_;
                      if (*(long *)&header[1].super_PortHeaderSyntax.super_SyntaxNode != 0) {
                        AVar20 = SemanticFacts::getDirection(*(TokenKind *)this_00);
                      }
                      _Var70._M_extent_value = *(size_t *)(pSVar6 + 3);
                      type.storage = (Storage *)0x0;
                      goto LAB_002278bd;
                    }
                    bVar16 = Symbol::isType((Symbol *)pNVar27);
                    if (bVar16) goto LAB_002277e3;
                  }
                  Compilation::tryGetDefinition
                            ((DefinitionLookupResult *)&local_430,(Compilation *)local_358._0_8_,
                             sVar68,(Scope *)local_358._8_8_);
                  uVar15 = local_358._8_8_;
                  iface._M_extent_value = (size_t)local_430.syntax.ptr;
                  if (((DefinitionSymbol *)local_430.syntax.ptr != (DefinitionSymbol *)0x0) &&
                     (((Symbol *)&(local_430.syntax.ptr)->super_SyntaxNode)->kind == Definition)) {
                    if ((int)((local_430.syntax.ptr)->dimensions).super_SyntaxListBase.childCount ==
                        1) {
                      if (header[1].super_PortHeaderSyntax.super_SyntaxNode.previewNode !=
                          (SyntaxNode *)0x0) {
                        SVar21 = parsing::Token::location
                                           ((Token *)&header[1].super_PortHeaderSyntax.
                                                      super_SyntaxNode.parent);
                        Scope::addDiag((Scope *)uVar15,(DiagCode)0xd80006,SVar21);
                      }
                      uVar15 = local_358._8_8_;
                      if (*(long *)&header[1].super_PortHeaderSyntax.super_SyntaxNode != 0) {
                        SVar21 = parsing::Token::location((Token *)this_00);
                        Scope::addDiag((Scope *)uVar15,(DiagCode)0x2e0006,SVar21);
                      }
                    }
                    else {
                      SVar69 = slang::syntax::SyntaxNode::sourceRange
                                         (*(SyntaxNode **)&header[1].nameOrKeyword);
                      pDVar29 = Scope::addDiag((Scope *)uVar15,(DiagCode)0xa10006,SVar69);
                      Diagnostic::operator<<
                                (pDVar29,((Symbol *)
                                         &((DeclaratorSyntax *)iface._M_extent_value)->
                                          super_SyntaxNode)->name);
                      Diagnostic::addNote(pDVar29,(DiagCode)0x50001,
                                          *(SourceLocation *)
                                           &((DeclaratorSyntax *)iface._M_extent_value)->name);
                      iface._M_extent_value = 0;
                    }
                    pSVar31 = pSVar6[2].previewNode;
                    _Var70._M_extent_value = *(size_t *)(pSVar6 + 3);
                    nVar34.ptr = (DeclaratorSyntax *)0x0;
                    pCVar38 = (ConfigBlockSymbol *)0x478002;
                    goto LAB_002276ee;
                  }
                }
LAB_002277e3:
                AVar20 = local_358._24_4_;
                if (*(long *)&header[1].super_PortHeaderSyntax.super_SyntaxNode != 0) {
                  AVar20 = SemanticFacts::getDirection(*(TokenKind *)this_00);
                }
                uVar15 = local_358._8_8_;
                if ((header[1].super_PortHeaderSyntax.super_SyntaxNode.previewNode ==
                     (SyntaxNode *)0x0) &&
                   ((AVar20 == InOut ||
                    ((AVar20 != Ref && (**(int **)&header[1].nameOrKeyword == 0xf7)))))) {
                  SVar21 = parsing::Token::location(&pDVar7->name);
                  pNVar27 = anon_unknown_0::getDefaultNetType((Scope *)uVar15,SVar21);
                }
                else {
                  pNVar27 = (NetType *)0x0;
                }
                _Var70._M_extent_value = *(size_t *)(pSVar6 + 3);
                type.storage = *(Storage **)&header[1].nameOrKeyword;
                goto LAB_002278bd;
              }
              _Var70._M_extent_value = *(size_t *)(pSVar6 + 3);
              if (local_328 == (DefinitionSymbol *)0x0 && (local_310 & 1U) == 0) {
                pNVar27 = (NetType *)local_338._8_8_;
                type.storage = (Storage *)local_338._0_8_;
                if ((Storage *)local_338._0_8_ == (Storage *)0x0 &&
                    (NetType *)local_338._8_8_ == (NetType *)0x0) {
                  local_430._0_16_ = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)pDVar7);
                  SVar21 = parsing::Token::location((Token *)&local_430);
                  type.storage = (Storage *)
                                 Compilation::createEmptyTypeSyntax((Compilation *)uVar15,SVar21);
                  local_338._0_8_ = type.storage;
                  AVar20 = local_358._24_4_;
                }
                goto LAB_002278bd;
              }
              type.storage = (Storage *)CONCAT71(acStack_31f,cStack_320);
              modport._M_len._1_1_ = acStack_31f[0];
              modport._M_len._2_1_ = acStack_31f[1];
              modport._M_len._3_1_ = acStack_31f[2];
              modport._M_len._4_1_ = acStack_31f[3];
              modport._M_len._5_1_ = acStack_31f[4];
              modport._M_len._6_1_ = acStack_31f[5];
              modport._M_len._7_1_ = acStack_31f[6];
              modport._M_len._0_1_ = cStack_320;
              modport._M_str = (char *)local_318;
              pNVar27 = local_318;
              pSVar28 = anon_unknown_0::AnsiPortListBuilder::add
                                  ((AnsiPortListBuilder *)local_358,pDVar7,local_328,modport,
                                   (bool)(local_328 == (DefinitionSymbol *)0x0 | local_310 & 1U),
                                   *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                                     *)&pSVar6[2].previewNode);
            }
            sVar68._M_str = (char *)pNVar27;
            sVar68._M_len = (size_t)type.storage;
          }
          local_430.syntax.ptr = (DeclaratorSyntax *)pSVar28;
        }
        else {
          local_430._0_16_ = parsing::Token::valueText((Token *)&pSVar6[4].previewNode);
          SVar21 = parsing::Token::location((Token *)&pSVar6[4].previewNode);
          local_488.pg = (group15<boost::unordered::detail::foa::plain_integral> *)SVar21;
          local_468.kind._0_1_ = 1;
          pPVar26 = BumpAllocator::
                    emplace<slang::ast::PortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,bool>
                              ((BumpAllocator *)uVar15,
                               (basic_string_view<char,_std::char_traits<char>_> *)&local_430,
                               (SourceLocation *)&local_488,(bool *)&local_468);
          AVar20 = local_358._24_4_;
          _Var70._M_extent_value = in_stack_fffffffffffffb40._M_extent_value;
          if (pSVar6[3].previewNode != (SyntaxNode *)0x0) {
            AVar20 = SemanticFacts::getDirection(*(TokenKind *)&pSVar6[3].parent);
            _Var70._M_extent_value = in_stack_fffffffffffffb40._M_extent_value;
          }
          pPVar26->direction = AVar20;
          (pPVar26->super_Symbol).originatingSyntax = pSVar6;
          sVar33 = *(size_t *)(pSVar6 + 3);
          Symbol::setAttributes
                    (&pPVar26->super_Symbol,(Scope *)local_358._8_8_,
                     *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                       *)&pSVar6[2].previewNode);
          sVar68._M_str = (char *)implicitMembers;
          sVar68._M_len = sVar33;
          if (*(long *)(pSVar6 + 6) == 0) {
            pPVar26->isNullPort = true;
          }
          local_358._24_4_ = pPVar26->direction;
          local_328 = (DefinitionSymbol *)0x0;
          cStack_320 = '\0';
          acStack_31f[0] = '\0';
          acStack_31f[1] = '\0';
          acStack_31f[2] = '\0';
          acStack_31f[3] = '\0';
          acStack_31f[4] = '\0';
          acStack_31f[5] = '\0';
          acStack_31f[6] = '\0';
          local_338 = (undefined1  [16])0x0;
          local_318 = (NetType *)0x478002;
          local_310 = false;
          local_430.syntax.ptr = (DeclaratorSyntax *)pPVar26;
        }
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)local_438,(Symbol **)&local_430);
        implicitMembers =
             (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)
             sVar68._M_str;
        lVar42 = lVar42 + 0x30;
        uVar40 = uVar40 - 1;
        in_stack_fffffffffffffb40._M_extent_value = _Var70._M_extent_value;
      } while (uVar40 != 0);
    }
    if (local_3b8 == (PortInfo *)0x0) {
      return;
    }
    local_430._0_16_ = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)local_3e0->data_);
    SVar21 = parsing::Token::location((Token *)&local_430);
    Scope::addDiag(local_440,(DiagCode)0x9f0006,SVar21);
    return;
  }
  local_358._0_8_ = *(undefined8 *)&syntax->super_SyntaxNode;
  local_78 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
              *)local_338;
  local_68 = 0x3f;
  local_60 = (Scope *)0x1;
  local_50 = (string_view *)0x0;
  local_58 = "";
  local_48 = (undefined1  [16])0x0;
  local_70 = local_78;
  if (in_R9 != (PortInfo *)0x0) {
    local_3b8 = (PortInfo *)(implicitMembers->firstElement + (long)in_R9 * 0x10 + -0x18);
    do {
      ppVar41 = implicitMembers->data_;
      local_390 = (Symbol *)implicitMembers->len;
      local_3e0 = implicitMembers;
      if (*(int *)&ppVar41->first == 0x16f) {
        pbVar39 = (byte *)((long)&(ppVar41[8].second)->kind + 1);
        if ((byte *)0x1 < pbVar39) {
          uVar40 = 0;
          local_470 = ppVar41;
          do {
            ppSVar25 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                 ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   *)(&(ppVar41[8].first)->kind + uVar40 * 0xc));
            pSVar6 = *ppSVar25;
            local_468._0_8_ = *(undefined8 *)(pSVar6 + 1);
            local_468.info = (Info *)pSVar6[1].parent;
            if ((local_468._0_8_ & 0x10000) == 0) {
              _local_498 = parsing::Token::valueText(&local_468);
              local_430.attrs._M_extent._M_extent_value = (size_t)ppVar41[4].second;
              local_430.attrs._M_ptr = (pointer)ppVar41[4].first;
              local_430.syntax.ptr = (DeclaratorSyntax *)pSVar6;
              local_430.modport._M_str._0_6_ = 0;
              local_430._62_8_ = 0;
              local_430.ifaceDef = (DefinitionSymbol *)0x0;
              local_430.modport._M_len._0_6_ = 0;
              local_430.modport._M_len._6_2_ = 0;
              local_430.internalSymbol = (Symbol *)0x0;
              local_430.insertionPoint = (Symbol *)0x0;
              local_448 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                          operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                      *)&local_70,
                                     (basic_string_view<char,_std::char_traits<char>_> *)local_498);
              pSVar35 = (Scope *)(local_448 >> ((byte)local_68 & 0x3f));
              lVar42 = (local_448 & 0xff) * 4;
              cVar50 = (&UNK_00474b6c)[lVar42];
              cVar53 = (&UNK_00474b6d)[lVar42];
              cVar54 = (&UNK_00474b6e)[lVar42];
              bVar55 = (&UNK_00474b6f)[lVar42];
              local_3c8 = (ulong)((uint)local_448 & 7);
              local_3c0 = local_50;
              auVar13 = local_498;
              pcVar32 = local_490;
              local_3d8 = local_60;
              pSVar36 = (Scope *)0x0;
              local_3d0 = local_58;
              cVar56 = cVar50;
              cVar57 = cVar53;
              cVar58 = cVar54;
              bVar59 = bVar55;
              cVar60 = cVar50;
              cVar61 = cVar53;
              cVar62 = cVar54;
              bVar63 = bVar55;
              cVar64 = cVar50;
              cVar65 = cVar53;
              cVar66 = cVar54;
              bVar67 = bVar55;
              local_3e8 = pSVar35;
              do {
                psVar43 = local_3c0;
                pcVar44 = local_3d0 + (long)pSVar35 * 0x10;
                local_378 = *pcVar44;
                cStack_377 = pcVar44[1];
                cStack_376 = pcVar44[2];
                bStack_375 = pcVar44[3];
                cStack_374 = pcVar44[4];
                cStack_373 = pcVar44[5];
                cStack_372 = pcVar44[6];
                bStack_371 = pcVar44[7];
                cStack_370 = pcVar44[8];
                cStack_36f = pcVar44[9];
                cStack_36e = pcVar44[10];
                bStack_36d = pcVar44[0xb];
                cStack_36c = pcVar44[0xc];
                cStack_36b = pcVar44[0xd];
                cStack_36a = pcVar44[0xe];
                bVar10 = pcVar44[0xf];
                auVar45[0] = -(local_378 == cVar50);
                auVar45[1] = -(cStack_377 == cVar53);
                auVar45[2] = -(cStack_376 == cVar54);
                auVar45[3] = -(bStack_375 == bVar55);
                auVar45[4] = -(cStack_374 == cVar56);
                auVar45[5] = -(cStack_373 == cVar57);
                auVar45[6] = -(cStack_372 == cVar58);
                auVar45[7] = -(bStack_371 == bVar59);
                auVar45[8] = -(cStack_370 == cVar60);
                auVar45[9] = -(cStack_36f == cVar61);
                auVar45[10] = -(cStack_36e == cVar62);
                auVar45[0xb] = -(bStack_36d == bVar63);
                auVar45[0xc] = -(cStack_36c == cVar64);
                auVar45[0xd] = -(cStack_36b == cVar65);
                auVar45[0xe] = -(cStack_36a == cVar66);
                auVar45[0xf] = -(bVar10 == bVar67);
                uVar19 = (uint)(ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe);
                local_450 = pSVar35;
                bStack_369 = bVar10;
                if (uVar19 != 0) {
                  local_3a8._0_2_ = CONCAT11(cVar53,cVar50);
                  local_3a8._0_3_ = CONCAT12(cVar54,(undefined2)local_3a8);
                  local_3a8._0_4_ = CONCAT13(bVar55,(undefined3)local_3a8);
                  local_3a8._0_5_ = CONCAT14(cVar56,(undefined4)local_3a8);
                  local_3a8._0_6_ = CONCAT15(cVar57,(undefined5)local_3a8);
                  local_3a8._0_7_ = CONCAT16(cVar58,(undefined6)local_3a8);
                  local_3a8 = (PortInfo *)CONCAT17(bVar59,(undefined7)local_3a8);
                  cStack_3a0 = cVar60;
                  cStack_39f = cVar61;
                  cStack_39e = cVar62;
                  bStack_39d = bVar63;
                  cStack_39c = cVar64;
                  cStack_39b = cVar65;
                  cStack_39a = cVar66;
                  bStack_399 = bVar67;
                  do {
                    uVar9 = 0;
                    if (uVar19 != 0) {
                      for (; (uVar19 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                      }
                    }
                    lVar42 = (ulong)uVar9 * 0x58;
                    if ((SourceLocation)auVar13 ==
                        *(SourceLocation *)((long)psVar43 + lVar42 + (long)pSVar35 * 0x528)) {
                      if ((SourceLocation)auVar13 != (SourceLocation)0x0) {
                        iVar18 = bcmp(pcVar32,*(void **)((long)psVar43 +
                                                        lVar42 + (long)pSVar35 * 0x528 + 8),
                                      (size_t)auVar13);
                        cVar50 = (char)local_3a8;
                        cVar53 = local_3a8._1_1_;
                        cVar54 = local_3a8._2_1_;
                        bVar55 = local_3a8._3_1_;
                        cVar56 = local_3a8._4_1_;
                        cVar57 = local_3a8._5_1_;
                        cVar58 = local_3a8._6_1_;
                        bVar59 = local_3a8._7_1_;
                        cVar60 = cStack_3a0;
                        cVar61 = cStack_39f;
                        cVar62 = cStack_39e;
                        bVar63 = bStack_39d;
                        cVar64 = cStack_39c;
                        cVar65 = cStack_39b;
                        cVar66 = cStack_39a;
                        bVar67 = bStack_399;
                        if (iVar18 != 0) goto LAB_0022683a;
                      }
                      SVar21 = parsing::Token::location(&local_468);
                      ppVar41 = local_470;
                      pDVar29 = Scope::addDiag(local_440,(DiagCode)0x2a000a,SVar21);
                      sVar68 = parsing::Token::valueText(&local_468);
                      Diagnostic::operator<<(pDVar29,sVar68);
                      SVar21 = parsing::Token::location
                                         ((Token *)(*(long *)((long)psVar43 +
                                                             lVar42 + (long)pSVar35 * 0x528 + 0x10)
                                                   + 0x18));
                      Diagnostic::addNote(pDVar29,(DiagCode)0xa0001,SVar21);
                      goto LAB_002266c8;
                    }
LAB_0022683a:
                    uVar19 = uVar19 - 1 & uVar19;
                  } while (uVar19 != 0);
                }
                if (((&boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::
                       is_not_overflowed(unsigned_long)::shift)[local_3c8] & bVar10) == 0) break;
                ppCVar12 = &pSVar36->compilation;
                pSVar36 = (Scope *)((long)&pSVar36->compilation + 1);
                pSVar35 = (Scope *)((ulong)((long)ppCVar12 +
                                           (long)((long)&local_450->compilation + 1)) &
                                   (ulong)local_3d8);
              } while (pSVar36 <= local_3d8);
              if ((ulong)local_48._8_8_ < (ulong)local_48._0_8_) {
                hash = local_498;
                in_R9 = &local_430;
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,704ul,16ul>>
                ::
                nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                          (&local_488,&local_68,(arrays_type *)local_3e8,local_448,(size_t)hash,
                           (try_emplace_args_t *)in_R9,in_stack_fffffffffffffb38,
                           (PortInfo *)in_stack_fffffffffffffb40._M_extent_value);
                bVar37.m_bits = (underlying_type)hash;
                local_48._8_8_ = local_48._8_8_ + 1;
              }
              else {
                args_1 = (Token *)&local_430;
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,704ul,16ul>>
                ::
                unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                          (&local_488,&local_70,local_448,(try_emplace_args_t *)local_498,
                           (basic_string_view<char,_std::char_traits<char>_> *)args_1,in_R9);
                bVar37.m_bits = (underlying_type)args_1;
              }
              ppVar14 = local_488.p;
              ((local_488.p)->second).insertionPoint = local_390;
              pSVar28 = local_470[5].first;
              pDVar7 = ((local_488.p)->second).syntax.ptr;
              sVar68 = parsing::Token::valueText(&pDVar7->name);
              local_488._0_16_ = sVar68;
              SVar21 = parsing::Token::location(&pDVar7->name);
              local_498 = (undefined1  [8])SVar21;
              SVar3 = (((PortHeaderSyntax *)&pSVar28->kind)->super_SyntaxNode).kind;
              if (SVar3 == InterfacePortHeader) {
                anon_unknown_0::getInterfacePortInfo
                          ((tuple<const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
                            *)&local_430,(Scope *)local_358._8_8_,
                           (InterfacePortHeaderSyntax *)pSVar28);
                uVar15 = local_358._8_8_;
                (ppVar14->second).isIface = true;
                (ppVar14->second).ifaceDef =
                     (DefinitionSymbol *)local_430.attrs._M_extent._M_extent_value;
                (ppVar14->second).modport._M_len = (size_t)local_430.syntax.ptr;
                (ppVar14->second).modport._M_str = (char *)local_430.attrs._M_ptr;
                if (pDVar7->initializer != (EqualsValueClauseSyntax *)0x0) {
                  SVar69 = slang::syntax::SyntaxNode::sourceRange
                                     (&pDVar7->initializer->super_SyntaxNode);
                  Scope::addDiag((Scope *)uVar15,(DiagCode)0x2f0006,SVar69);
                }
              }
              else {
                local_3a8 = &ppVar14->second;
                if (SVar3 == NetPortHeader) {
                  AVar20 = SemanticFacts::getDirection(((Token *)&pSVar28->location)->kind);
                  uVar15 = local_358._0_8_;
                  (ppVar14->second).direction = AVar20;
                  pNVar27 = Compilation::getNetType
                                      ((Compilation *)local_358._0_8_,
                                       *(TokenKind *)&pSVar28->nextInScope);
                  pNVar22 = BumpAllocator::
                            emplace<slang::ast::NetSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::NetType_const&>
                                      ((BumpAllocator *)uVar15,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       &local_488,(SourceLocation *)local_498,pNVar27);
                  pSVar31 = pSVar28->originatingSyntax;
LAB_0022698d:
                  anon_unknown_0::NonAnsiPortListBuilder::setInternalSymbol
                            ((NonAnsiPortListBuilder *)local_358,&pNVar22->super_ValueSymbol,pDVar7,
                             (DataTypeSyntax *)pSVar31,local_3a8);
                }
                else {
                  AVar20 = SemanticFacts::getDirection(*(TokenKind *)&pSVar28->nextInScope);
                  (ppVar14->second).direction = AVar20;
                  if (pSVar28->parentScope != (Scope *)0x0) {
                    local_450 = (Scope *)local_358._8_8_;
                    SVar69 = parsing::Token::range((Token *)&pSVar28->location);
                    Scope::addDiag(local_450,(DiagCode)0x1e0006,SVar69);
                  }
                  if (*(SyntaxNode **)(pSVar28 + 1) == (SyntaxNode *)0x0) {
                    syntax_00 = (DataTypeSyntax *)pSVar28[1].name._M_len;
                    if ((syntax_00->super_ExpressionSyntax).super_SyntaxNode.kind != ImplicitType) {
                      sVar68 = slang::syntax::SyntaxFacts::getSimpleTypeName(syntax_00);
                      name_00._M_len = sVar68._M_str;
                      name_00._M_str = (char *)0x1;
                      pNVar27 = (NetType *)
                                Lookup::unqualified((Lookup *)local_358._8_8_,(Scope *)sVar68._M_len
                                                    ,name_00,bVar37);
                      if ((pNVar27 != (NetType *)0x0) && ((pNVar27->super_Symbol).kind == NetType))
                      {
                        pNVar22 = BumpAllocator::
                                  emplace<slang::ast::NetSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::NetType_const&>
                                            ((BumpAllocator *)local_358._0_8_,
                                             (basic_string_view<char,_std::char_traits<char>_> *)
                                             &local_488,(SourceLocation *)local_498,pNVar27);
                        pSVar31 = (SyntaxNode *)0x0;
                        goto LAB_0022698d;
                      }
                      goto LAB_00226ace;
                    }
                    pSVar23 = Scope::find((Scope *)local_358._8_8_,sVar68);
                    uVar15 = local_358._0_8_;
                    if ((pSVar23 == (Symbol *)0x0) || (1 < pSVar23->kind - Net)) {
                      pNVar27 = anon_unknown_0::getDefaultNetType((Scope *)local_358._8_8_,SVar21);
                      pNVar22 = BumpAllocator::
                                emplace<slang::ast::NetSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::NetType_const&>
                                          ((BumpAllocator *)uVar15,
                                           (basic_string_view<char,_std::char_traits<char>_> *)
                                           &local_488,(SourceLocation *)local_498,pNVar27);
                      goto LAB_00226afc;
                    }
                    (ppVar14->second).internalSymbol = pSVar23;
                    pSVar4 = (ppVar14->second).insertionPoint;
                    if (pSVar4 == (Symbol *)0x0) {
                      SVar30 = 1;
                    }
                    else {
                      SVar30 = pSVar4->indexInScope + 1;
                    }
                    if (SVar30 < pSVar23->indexInScope) {
                      *(SymbolIndex *)((long)&pSVar23[1].originatingSyntax + 4) =
                           *(SymbolIndex *)((long)&pSVar23[1].originatingSyntax + 4) & 0xc0000000 |
                           pSVar23->indexInScope & 0x3fffffff;
                      pSVar23->indexInScope = SVar30;
                    }
                    unpackedDimensions._M_ptr =
                         (pDVar7->dimensions).
                         super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
                         ._M_ptr;
                    unpackedDimensions._M_extent._M_extent_value =
                         (pDVar7->dimensions).
                         super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
                         ._M_extent._M_extent_value;
                    DeclaredType::mergeImplicitPort
                              ((DeclaredType *)(pSVar23 + 1),
                               (ImplicitTypeSyntax *)pSVar28[1].name._M_len,SVar21,
                               unpackedDimensions);
                  }
                  else {
LAB_00226ace:
                    local_430.syntax.ptr._0_4_ = 1;
                    pNVar22 = (NetSymbol *)
                              BumpAllocator::
                              emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::VariableLifetime>
                                        ((BumpAllocator *)local_358._0_8_,
                                         (basic_string_view<char,_std::char_traits<char>_> *)
                                         &local_488,(SourceLocation *)local_498,
                                         (VariableLifetime *)&local_430);
LAB_00226afc:
                    anon_unknown_0::NonAnsiPortListBuilder::setInternalSymbol
                              ((NonAnsiPortListBuilder *)local_358,&pNVar22->super_ValueSymbol,
                               pDVar7,(DataTypeSyntax *)pSVar28[1].name._M_len,local_3a8);
                  }
                  if (((ppVar14->second).direction == InOut) &&
                     (((ppVar14->second).internalSymbol)->kind != Net)) {
                    pDVar29 = Scope::addDiag((Scope *)local_358._8_8_,(DiagCode)0x490006,
                                             (SourceLocation)local_498);
                    Diagnostic::operator<<(pDVar29,(string_view)local_488._0_16_);
                  }
                }
              }
              pSVar28 = (ppVar14->second).internalSymbol;
              if (pSVar28 == (Symbol *)0x0) {
                AVar20 = (ppVar14->second).direction;
                bVar16 = false;
LAB_00226c06:
                ppVar41 = local_470;
                if (AVar20 == Out && !bVar16) goto LAB_002266c8;
              }
              else {
                SVar2 = pSVar28->kind;
                bVar16 = SVar2 == Net;
                AVar20 = (ppVar14->second).direction;
                if (AVar20 == Ref && bVar16) {
                  pDVar29 = Scope::addDiag((Scope *)local_358._8_8_,(DiagCode)0xbc0006,
                                           (SourceLocation)local_498);
                  Diagnostic::operator<<(pDVar29,(string_view)local_488._0_16_);
                  AVar20 = (ppVar14->second).direction;
                }
                if (AVar20 != InOut || SVar2 != Net) goto LAB_00226c06;
                if (*(int *)((ppVar14->second).internalSymbol[5].name._M_str + 0x80) == 0xc) {
                  pDVar29 = Scope::addDiag((Scope *)local_358._8_8_,(DiagCode)0x4a0006,
                                           (SourceLocation)local_498);
                  Diagnostic::operator<<(pDVar29,(string_view)local_488._0_16_);
                }
              }
              uVar15 = local_358._8_8_;
              ppVar41 = local_470;
              if (pDVar7->initializer != (EqualsValueClauseSyntax *)0x0) {
                SVar69 = slang::syntax::SyntaxNode::sourceRange
                                   (&pDVar7->initializer->super_SyntaxNode);
                Scope::addDiag((Scope *)uVar15,(DiagCode)0x2f0006,SVar69);
                ppVar41 = local_470;
              }
            }
LAB_002266c8:
            uVar40 = uVar40 + 1;
          } while (uVar40 != (ulong)pbVar39 >> 1);
        }
      }
      else {
        sVar68 = parsing::Token::valueText((Token *)((long)(ppVar41[8].second)->location + 0x18));
        Compilation::tryGetDefinition
                  ((DefinitionLookupResult *)&local_430,(Compilation *)local_358._0_8_,sVar68,
                   local_440);
        pbVar39 = (byte *)((long)&(ppVar41[0xc].first)->kind + 1);
        if ((byte *)0x1 < pbVar39) {
          local_380 = (DefinitionSymbol *)local_430.syntax.ptr;
          uVar40 = 0;
          local_470 = ppVar41;
          do {
            ppSVar25 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                 ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   *)(&(ppVar41[0xb].second)->kind + uVar40 * 0xc));
            pSVar35 = (Scope *)*ppSVar25;
            local_468._0_8_ = pSVar35->firstMember;
            local_468.info = (Info *)pSVar35->lastMember;
            if ((local_468._0_8_ & 0x10000) == 0) {
              _local_498 = parsing::Token::valueText(&local_468);
              local_430.attrs._M_extent._M_extent_value = (size_t)ppVar41[4].second;
              local_430.attrs._M_ptr = (pointer)ppVar41[4].first;
              local_430.syntax.ptr = (DeclaratorSyntax *)pSVar35;
              local_430.modport._M_str._0_6_ = 0;
              local_430._62_8_ = 0;
              local_430.ifaceDef = (DefinitionSymbol *)0x0;
              local_430.modport._M_len._0_6_ = 0;
              local_430.modport._M_len._6_2_ = 0;
              local_430.internalSymbol = (Symbol *)0x0;
              local_430.insertionPoint = (Symbol *)0x0;
              local_3e8 = pSVar35;
              local_448 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                          operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                      *)&local_70,
                                     (basic_string_view<char,_std::char_traits<char>_> *)local_498);
              pSVar36 = (Scope *)(local_448 >> ((byte)local_68 & 0x3f));
              lVar42 = (local_448 & 0xff) * 4;
              cVar50 = (&UNK_00474b6c)[lVar42];
              cVar53 = (&UNK_00474b6d)[lVar42];
              cVar54 = (&UNK_00474b6e)[lVar42];
              bVar55 = (&UNK_00474b6f)[lVar42];
              local_3c8 = (ulong)((uint)local_448 & 7);
              local_3c0 = local_50;
              auVar13 = local_498;
              pcVar32 = local_490;
              local_388 = local_60;
              pSVar35 = (Scope *)0x0;
              local_3d0 = local_58;
              cVar56 = cVar50;
              cVar57 = cVar53;
              cVar58 = cVar54;
              bVar59 = bVar55;
              cVar60 = cVar50;
              cVar61 = cVar53;
              cVar62 = cVar54;
              bVar63 = bVar55;
              cVar64 = cVar50;
              cVar65 = cVar53;
              cVar66 = cVar54;
              bVar67 = bVar55;
              local_3d8 = pSVar36;
              do {
                psVar43 = local_3c0;
                pcVar44 = local_3d0 + (long)pSVar36 * 0x10;
                local_368 = *pcVar44;
                cStack_367 = pcVar44[1];
                cStack_366 = pcVar44[2];
                bStack_365 = pcVar44[3];
                cStack_364 = pcVar44[4];
                cStack_363 = pcVar44[5];
                cStack_362 = pcVar44[6];
                bStack_361 = pcVar44[7];
                cStack_360 = pcVar44[8];
                cStack_35f = pcVar44[9];
                cStack_35e = pcVar44[10];
                bStack_35d = pcVar44[0xb];
                cStack_35c = pcVar44[0xc];
                cStack_35b = pcVar44[0xd];
                cStack_35a = pcVar44[0xe];
                bVar10 = pcVar44[0xf];
                auVar46[0] = -(local_368 == cVar50);
                auVar46[1] = -(cStack_367 == cVar53);
                auVar46[2] = -(cStack_366 == cVar54);
                auVar46[3] = -(bStack_365 == bVar55);
                auVar46[4] = -(cStack_364 == cVar56);
                auVar46[5] = -(cStack_363 == cVar57);
                auVar46[6] = -(cStack_362 == cVar58);
                auVar46[7] = -(bStack_361 == bVar59);
                auVar46[8] = -(cStack_360 == cVar60);
                auVar46[9] = -(cStack_35f == cVar61);
                auVar46[10] = -(cStack_35e == cVar62);
                auVar46[0xb] = -(bStack_35d == bVar63);
                auVar46[0xc] = -(cStack_35c == cVar64);
                auVar46[0xd] = -(cStack_35b == cVar65);
                auVar46[0xe] = -(cStack_35a == cVar66);
                auVar46[0xf] = -(bVar10 == bVar67);
                uVar19 = (uint)(ushort)((ushort)(SUB161(auVar46 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe);
                local_450 = pSVar36;
                bStack_359 = bVar10;
                if (uVar19 != 0) {
                  local_3a8._0_2_ = CONCAT11(cVar53,cVar50);
                  local_3a8._0_3_ = CONCAT12(cVar54,(undefined2)local_3a8);
                  local_3a8._0_4_ = CONCAT13(bVar55,(undefined3)local_3a8);
                  local_3a8._0_5_ = CONCAT14(cVar56,(undefined4)local_3a8);
                  local_3a8._0_6_ = CONCAT15(cVar57,(undefined5)local_3a8);
                  local_3a8._0_7_ = CONCAT16(cVar58,(undefined6)local_3a8);
                  local_3a8 = (PortInfo *)CONCAT17(bVar59,(undefined7)local_3a8);
                  cStack_3a0 = cVar60;
                  cStack_39f = cVar61;
                  cStack_39e = cVar62;
                  bStack_39d = bVar63;
                  cStack_39c = cVar64;
                  cStack_39b = cVar65;
                  cStack_39a = cVar66;
                  bStack_399 = bVar67;
                  do {
                    uVar9 = 0;
                    if (uVar19 != 0) {
                      for (; (uVar19 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                      }
                    }
                    lVar42 = (ulong)uVar9 * 0x58;
                    if ((SourceLocation)auVar13 ==
                        *(SourceLocation *)((long)psVar43 + lVar42 + (long)pSVar36 * 0x528)) {
                      if ((SourceLocation)auVar13 != (SourceLocation)0x0) {
                        iVar18 = bcmp(pcVar32,*(void **)((long)psVar43 +
                                                        lVar42 + (long)pSVar36 * 0x528 + 8),
                                      (size_t)auVar13);
                        cVar50 = (char)local_3a8;
                        cVar53 = local_3a8._1_1_;
                        cVar54 = local_3a8._2_1_;
                        bVar55 = local_3a8._3_1_;
                        cVar56 = local_3a8._4_1_;
                        cVar57 = local_3a8._5_1_;
                        cVar58 = local_3a8._6_1_;
                        bVar59 = local_3a8._7_1_;
                        cVar60 = cStack_3a0;
                        cVar61 = cStack_39f;
                        cVar62 = cStack_39e;
                        bVar63 = bStack_39d;
                        cVar64 = cStack_39c;
                        cVar65 = cStack_39b;
                        cVar66 = cStack_39a;
                        bVar67 = bStack_399;
                        if (iVar18 != 0) goto LAB_00226fc4;
                      }
                      SVar21 = parsing::Token::location(&local_468);
                      ppVar41 = local_470;
                      pDVar29 = Scope::addDiag(local_440,(DiagCode)0x2a000a,SVar21);
                      sVar68 = parsing::Token::valueText(&local_468);
                      Diagnostic::operator<<(pDVar29,sVar68);
                      SVar21 = parsing::Token::location
                                         ((Token *)(*(long *)((long)psVar43 +
                                                             lVar42 + (long)pSVar36 * 0x528 + 0x10)
                                                   + 0x18));
                      Diagnostic::addNote(pDVar29,(DiagCode)0xa0001,SVar21);
                      goto LAB_00226e48;
                    }
LAB_00226fc4:
                    uVar19 = uVar19 - 1 & uVar19;
                  } while (uVar19 != 0);
                }
                if (((&boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::
                       is_not_overflowed(unsigned_long)::shift)[local_3c8] & bVar10) == 0) break;
                ppCVar12 = &pSVar35->compilation;
                pSVar35 = (Scope *)((long)&pSVar35->compilation + 1);
                pSVar36 = (Scope *)((ulong)((long)ppCVar12 +
                                           (long)((long)&local_450->compilation + 1)) &
                                   (ulong)local_388);
              } while (pSVar35 <= local_388);
              if ((ulong)local_48._8_8_ < (ulong)local_48._0_8_) {
                in_R9 = &local_430;
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,704ul,16ul>>
                ::
                nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                          (&local_488,&local_68,(arrays_type *)local_3d8,local_448,(size_t)local_498
                           ,(try_emplace_args_t *)in_R9,in_stack_fffffffffffffb38,
                           (PortInfo *)in_stack_fffffffffffffb40._M_extent_value);
                local_48._8_8_ = local_48._8_8_ + 1;
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,704ul,16ul>>
                ::
                unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                          (&local_488,&local_70,local_448,(try_emplace_args_t *)local_498,
                           (basic_string_view<char,_std::char_traits<char>_> *)&local_430,in_R9);
              }
              ppVar41 = local_470;
              ((local_488.p)->second).isIface = true;
              ((local_488.p)->second).ifaceDef = local_380;
              ((local_488.p)->second).insertionPoint = local_390;
              if (*(SyntaxNode **)&local_3e8[1].deferredMemberIndex != (SyntaxNode *)0x0) {
                SVar69 = slang::syntax::SyntaxNode::sourceRange
                                   (*(SyntaxNode **)&local_3e8[1].deferredMemberIndex);
                Scope::addDiag(local_440,(DiagCode)0x2f0006,SVar69);
              }
            }
LAB_00226e48:
            uVar40 = uVar40 + 1;
          } while (uVar40 != (ulong)pbVar39 >> 1);
        }
      }
      implicitMembers =
           (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)
           &local_3e0->cap;
    } while ((PortInfo *)implicitMembers != local_3b8);
  }
  pbVar39 = (byte *)((long)&(local_3b0->type->super_Symbol).kind + 1);
  if ((byte *)0x1 < pbVar39) {
    uVar40 = (ulong)pbVar39 >> 1;
    lVar42 = 0;
    do {
      ppSVar25 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            (*(long *)&local_3b0->direction + lVar42));
      uVar15 = local_358._0_8_;
      pSVar6 = *ppSVar25;
      if (pSVar6->kind == EmptyNonAnsiPort) {
        SVar21 = parsing::Token::location((Token *)(pSVar6 + 1));
        local_430.syntax.ptr = (DeclaratorSyntax *)SVar21;
        local_468._0_8_ = local_468._0_8_ & 0xffffffffffffff00;
        pPVar26 = BumpAllocator::
                  emplace<slang::ast::PortSymbol,char_const(&)[1],slang::SourceLocation,bool>
                            ((BumpAllocator *)uVar15,(char (*) [1])0x478002,
                             (SourceLocation *)&local_430,(bool *)&local_468);
        pPVar26->direction = In;
        (pPVar26->super_Symbol).originatingSyntax = pSVar6;
        pPVar26->isNullPort = true;
        local_488.pg = (group15<boost::unordered::detail::foa::plain_integral> *)pPVar26;
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)local_438,(Symbol **)&local_488);
      }
      else if (pSVar6->kind == ExplicitNonAnsiPort) {
        name_02 = (Token)parsing::Token::valueText((Token *)&pSVar6[1].previewNode);
        local_430._0_16_ = name_02;
        SVar21 = parsing::Token::location((Token *)&pSVar6[1].previewNode);
        local_488.pg = (group15<boost::unordered::detail::foa::plain_integral> *)SVar21;
        pPVar5 = *(PortConcatenationSyntax **)(pSVar6 + 3);
        if (pPVar5 == (PortConcatenationSyntax *)0x0) {
          auVar11[0xf] = 0;
          auVar11._0_15_ = stack0xfffffffffffffb69;
          _local_498 = (string_view)(auVar11 << 8);
          local_468._0_8_ =
               BumpAllocator::
               emplace<slang::ast::PortSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,bool>
                         ((BumpAllocator *)local_358._0_8_,
                          (basic_string_view<char,_std::char_traits<char>_> *)&local_430,
                          (SourceLocation *)&local_488,(bool *)local_498);
          ((PortSymbol *)local_468._0_8_)->direction = In;
          (((PortSymbol *)local_468._0_8_)->super_Symbol).originatingSyntax = pSVar6;
          ((PortSymbol *)local_468._0_8_)->isNullPort = true;
        }
        else if ((pPVar5->super_PortExpressionSyntax).super_SyntaxNode.kind == PortReference) {
          local_468._0_8_ =
               anon_unknown_0::NonAnsiPortListBuilder::createPort
                         ((NonAnsiPortListBuilder *)local_358,(string_view)name_02,SVar21,
                          (PortReferenceSyntax *)pPVar5);
        }
        else {
          local_468._0_8_ =
               anon_unknown_0::NonAnsiPortListBuilder::createPort
                         ((NonAnsiPortListBuilder *)local_358,(string_view)name_02,SVar21,pPVar5);
        }
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)local_438,(Symbol **)&local_468);
      }
      else {
        local_430._0_16_ = slang::syntax::SyntaxNode::getFirstToken(*(SyntaxNode **)(pSVar6 + 1));
        SVar21 = parsing::Token::location((Token *)&local_430);
        pPVar5 = *(PortConcatenationSyntax **)(pSVar6 + 1);
        if ((pPVar5->super_PortExpressionSyntax).super_SyntaxNode.kind == PortReference) {
          pSVar28 = anon_unknown_0::NonAnsiPortListBuilder::createPort
                              ((NonAnsiPortListBuilder *)local_358,
                               (string_view)(ZEXT816(0x478002) << 0x40),SVar21,
                               (PortReferenceSyntax *)pPVar5);
        }
        else {
          pSVar28 = anon_unknown_0::NonAnsiPortListBuilder::createPort
                              ((NonAnsiPortListBuilder *)local_358,
                               (string_view)(ZEXT816(0x478002) << 0x40),SVar21,pPVar5);
        }
        local_488.pg = (group15<boost::unordered::detail::foa::plain_integral> *)pSVar28;
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)local_438,(Symbol **)&local_488);
      }
      lVar42 = lVar42 + 0x30;
      uVar40 = uVar40 - 1;
    } while (uVar40 != 0);
  }
  if (local_50 == (string_view *)0x0) {
LAB_00227ac0:
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
    ::delete_arrays(local_70,(arrays_type *)local_60);
    return;
  }
  auVar47[0] = -(*local_58 == '\0');
  auVar47._1_7_ = 0;
  auVar47[8] = -(local_58[8] == '\0');
  auVar47[9] = -(local_58[9] == '\0');
  auVar47[10] = -(local_58[10] == '\0');
  auVar47[0xb] = -(local_58[0xb] == '\0');
  auVar47[0xc] = -(local_58[0xc] == '\0');
  auVar47[0xd] = -(local_58[0xd] == '\0');
  auVar47[0xe] = -(local_58[0xe] == '\0');
  auVar47[0xf] = -(local_58[0xf] == '\0');
  pcVar32 = local_58;
  psVar43 = local_50;
  pcVar44 = local_58;
  if ((auVar47 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    do {
      psVar43 = (string_view *)&psVar43[5]._M_str;
      if (((uint)pcVar32 & 0xf) == 0xe) {
        auVar51[0] = -(pcVar44[2] == '\0');
        auVar51[1] = -(pcVar44[3] == '\0');
        auVar51[2] = -(pcVar44[4] == '\0');
        auVar51[3] = -(pcVar44[5] == '\0');
        auVar51[4] = -(pcVar44[6] == '\0');
        auVar51[5] = -(pcVar44[7] == '\0');
        auVar51[6] = -(pcVar44[8] == '\0');
        auVar51[7] = -(pcVar44[9] == '\0');
        auVar51[8] = -(pcVar44[10] == '\0');
        auVar51[9] = -(pcVar44[0xb] == '\0');
        auVar51[10] = -(pcVar44[0xc] == '\0');
        auVar51[0xb] = -(pcVar44[0xd] == '\0');
        auVar51[0xc] = -(pcVar44[0xe] == '\0');
        auVar51[0xd] = -(pcVar44[0xf] == '\0');
        auVar51[0xe] = -(pcVar44[0x10] == '\0');
        auVar51[0xf] = -(pcVar44[0x11] == '\0');
        uVar17 = (ushort)(SUB161(auVar51 >> 7,0) & 1) | (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe;
        if (uVar17 == 0x7fff) {
          pcVar32 = pcVar44 + 0x12;
          do {
            pcVar44 = pcVar32;
            psVar43 = (string_view *)((long)psVar43 + 0x528);
            auVar52[0] = -(*pcVar44 == '\0');
            auVar52[1] = -(pcVar44[1] == '\0');
            auVar52[2] = -(pcVar44[2] == '\0');
            auVar52[3] = -(pcVar44[3] == '\0');
            auVar52[4] = -(pcVar44[4] == '\0');
            auVar52[5] = -(pcVar44[5] == '\0');
            auVar52[6] = -(pcVar44[6] == '\0');
            auVar52[7] = -(pcVar44[7] == '\0');
            auVar52[8] = -(pcVar44[8] == '\0');
            auVar52[9] = -(pcVar44[9] == '\0');
            auVar52[10] = -(pcVar44[10] == '\0');
            auVar52[0xb] = -(pcVar44[0xb] == '\0');
            auVar52[0xc] = -(pcVar44[0xc] == '\0');
            auVar52[0xd] = -(pcVar44[0xd] == '\0');
            auVar52[0xe] = -(pcVar44[0xe] == '\0');
            auVar52[0xf] = -(pcVar44[0xf] == '\0');
            uVar17 = (ushort)(SUB161(auVar52 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe;
            pcVar32 = pcVar44 + 0x10;
          } while (uVar17 == 0x7fff);
        }
        else {
          pcVar44 = pcVar44 + 2;
        }
        uVar19 = 0;
        if ((uVar17 ^ 0x7fff) != 0) {
          for (; ((uVar17 ^ 0x7fff) >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
          }
        }
        uVar40 = (ulong)uVar19;
        if (pcVar44[uVar40] != '\x01') {
          pcVar44 = pcVar44 + uVar40;
          psVar43 = (string_view *)((long)psVar43 + uVar40 * 0xb * 8);
          goto LAB_002273c2;
        }
        goto LAB_00227ac0;
      }
      pcVar1 = pcVar44 + 1;
      pcVar44 = pcVar44 + 1;
      pcVar32 = pcVar32 + 1;
    } while (*pcVar1 == '\0');
    if (*pcVar1 == '\x01') goto LAB_00227ac0;
  }
LAB_002273c2:
  do {
    uVar15 = local_358._8_8_;
    if (*(char *)((long)&psVar43[5]._M_len + 4) == '\0') {
      SVar69 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)psVar43[1]._M_len);
      pDVar29 = Scope::addDiag((Scope *)uVar15,(DiagCode)0xd40006,SVar69);
      Diagnostic::operator<<(pDVar29,*psVar43);
    }
    pcVar32 = pcVar44 + 0x12;
    pcVar1 = pcVar44 + 2;
    while (pcVar24 = pcVar1, psVar43 = (string_view *)&psVar43[5]._M_str,
          ((uint)pcVar44 & 0xf) != 0xe) {
      pcVar44 = pcVar44 + 1;
      pcVar32 = pcVar32 + 1;
      pcVar1 = pcVar24 + 1;
      if (pcVar24[-1] != '\0') goto code_r0x00227427;
    }
    auVar48[0] = -(*pcVar24 == '\0');
    auVar48[1] = -(pcVar24[1] == '\0');
    auVar48[2] = -(pcVar24[2] == '\0');
    auVar48[3] = -(pcVar24[3] == '\0');
    auVar48[4] = -(pcVar24[4] == '\0');
    auVar48[5] = -(pcVar24[5] == '\0');
    auVar48[6] = -(pcVar24[6] == '\0');
    auVar48[7] = -(pcVar24[7] == '\0');
    auVar48[8] = -(pcVar24[8] == '\0');
    auVar48[9] = -(pcVar24[9] == '\0');
    auVar48[10] = -(pcVar24[10] == '\0');
    auVar48[0xb] = -(pcVar24[0xb] == '\0');
    auVar48[0xc] = -(pcVar24[0xc] == '\0');
    auVar48[0xd] = -(pcVar24[0xd] == '\0');
    auVar48[0xe] = -(pcVar24[0xe] == '\0');
    auVar48[0xf] = -(pcVar24[0xf] == '\0');
    uVar17 = (ushort)(SUB161(auVar48 >> 7,0) & 1) | (ushort)(SUB161(auVar48 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar48 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar48 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar48 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar48 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar48 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar48 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar48 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar48 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar48 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar48 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar48 >> 0x77,0) & 1) << 0xe;
    while (uVar17 == 0x7fff) {
      psVar43 = (string_view *)((long)psVar43 + 0x528);
      auVar49[0] = -(*pcVar32 == '\0');
      auVar49[1] = -(pcVar32[1] == '\0');
      auVar49[2] = -(pcVar32[2] == '\0');
      auVar49[3] = -(pcVar32[3] == '\0');
      auVar49[4] = -(pcVar32[4] == '\0');
      auVar49[5] = -(pcVar32[5] == '\0');
      auVar49[6] = -(pcVar32[6] == '\0');
      auVar49[7] = -(pcVar32[7] == '\0');
      auVar49[8] = -(pcVar32[8] == '\0');
      auVar49[9] = -(pcVar32[9] == '\0');
      auVar49[10] = -(pcVar32[10] == '\0');
      auVar49[0xb] = -(pcVar32[0xb] == '\0');
      auVar49[0xc] = -(pcVar32[0xc] == '\0');
      auVar49[0xd] = -(pcVar32[0xd] == '\0');
      auVar49[0xe] = -(pcVar32[0xe] == '\0');
      auVar49[0xf] = -(pcVar32[0xf] == '\0');
      pcVar24 = pcVar32;
      pcVar32 = pcVar32 + 0x10;
      uVar17 = (ushort)(SUB161(auVar49 >> 7,0) & 1) | (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe;
    }
    uVar19 = 0;
    if ((uVar17 ^ 0x7fff) != 0) {
      for (; ((uVar17 ^ 0x7fff) >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
      }
    }
    uVar40 = (ulong)uVar19;
    if (pcVar24[uVar40] == '\x01') goto LAB_00227ac0;
    psVar43 = (string_view *)((long)psVar43 + uVar40 * 0xb * 8);
    pcVar44 = pcVar24 + uVar40;
  } while( true );
code_r0x00227427:
  if (pcVar24[-1] == '\x01') goto LAB_00227ac0;
  pcVar44 = pcVar24 + -1;
  goto LAB_002273c2;
}

Assistant:

void PortSymbol::fromSyntax(
    const PortListSyntax& syntax, const Scope& scope, SmallVectorBase<const Symbol*>& results,
    SmallVectorBase<std::pair<Symbol*, const Symbol*>>& implicitMembers,
    std::span<std::pair<const SyntaxNode*, const Symbol*> const> portDeclarations) {

    switch (syntax.kind) {
        case SyntaxKind::AnsiPortList: {
            AnsiPortListBuilder builder{scope, implicitMembers};
            for (auto port : syntax.as<AnsiPortListSyntax>().ports) {
                switch (port->kind) {
                    case SyntaxKind::ImplicitAnsiPort:
                        results.push_back(builder.createPort(port->as<ImplicitAnsiPortSyntax>()));
                        break;
                    case SyntaxKind::ExplicitAnsiPort:
                        results.push_back(builder.createPort(port->as<ExplicitAnsiPortSyntax>()));
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
            }

            if (!portDeclarations.empty()) {
                scope.addDiag(diag::PortDeclInANSIModule,
                              portDeclarations[0].first->getFirstToken().location());
            }
            break;
        }
        case SyntaxKind::NonAnsiPortList: {
            NonAnsiPortListBuilder builder{scope, portDeclarations, implicitMembers};
            for (auto port : syntax.as<NonAnsiPortListSyntax>().ports) {
                switch (port->kind) {
                    case SyntaxKind::ImplicitNonAnsiPort:
                        results.push_back(
                            builder.createPort(port->as<ImplicitNonAnsiPortSyntax>()));
                        break;
                    case SyntaxKind::ExplicitNonAnsiPort:
                        results.push_back(
                            builder.createPort(port->as<ExplicitNonAnsiPortSyntax>()));
                        break;
                    case SyntaxKind::EmptyNonAnsiPort:
                        results.push_back(builder.createPort(port->as<EmptyNonAnsiPortSyntax>()));
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
            }
            builder.finalize();
            break;
        }
        default:
            SLANG_UNREACHABLE;
    }
}